

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includeDirs,cmGeneratorTarget *target,string *lang,bool forceFullPaths,
          bool forResponseFile,string *config)

{
  cmMakefile *pcVar1;
  size_type sVar2;
  pointer pcVar3;
  byte bVar4;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Source_cmLocalGenerator_cxx:214:5)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_micst[P]CMake_Source_cmLocalGenerator_cxx:214:5)>
  __comp_00;
  pointer __last;
  bool bVar5;
  string *psVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  ostream *poVar11;
  char *pcVar12;
  char *pcVar13;
  pointer pbVar14;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  char *local_310;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string flagVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string includePath;
  string sysFwSearchFlagVar;
  string fwSearchFlagVar;
  string sysFlagVar;
  string local_1c8;
  ostringstream includeFlags;
  long local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  
  if (lang->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&includeFlags);
  }
  else {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&includes,includeDirs);
    __last = includes.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar14 = includes.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    flagVar._M_dataplus._M_p = (pointer)target;
    if (target != (cmGeneratorTarget *)0x0) {
      emitted._M_t._M_impl._0_8_ = &flagVar;
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = config;
      emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)lang;
      if (includes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          includes.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&includeFlags,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             )includes.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                            (((long)includes.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)includes.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5) + 1) / 2);
        if (local_198 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          __comp_00._M_comp.config =
               (string *)emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          __comp_00._M_comp.target = (cmGeneratorTarget **)emitted._M_t._M_impl._0_8_;
          __comp_00._M_comp.lang =
               (string *)emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar14,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last,__comp_00);
        }
        else {
          __comp._M_comp.config =
               (string *)emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
          __comp._M_comp.target = (cmGeneratorTarget **)emitted._M_t._M_impl._0_8_;
          __comp._M_comp.lang =
               (string *)emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string*,long,__gnu_cxx::__ops::_Iter_comp_iter<MoveSystemIncludesToEnd(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*)::__0>>
                    ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )pbVar14,
                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      )__last,local_198,local_1a0,__comp);
        }
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Temporary_buffer
                  ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&includeFlags);
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&includeFlags);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&flagVar,"CMAKE_INCLUDE_FLAG_",(allocator<char> *)&emitted);
    std::__cxx11::string::append((string *)&flagVar);
    psVar6 = cmMakefile::GetSafeDefinition(this->Makefile,&flagVar);
    std::__cxx11::string::assign((char *)&flagVar);
    std::__cxx11::string::append((string *)&flagVar);
    pcVar7 = cmMakefile::GetDefinition(this->Makefile,&flagVar);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&emitted,"CMAKE_QUOTE_INCLUDE_PATHS",(allocator<char> *)&sysFlagVar);
    pcVar8 = cmMakefile::GetDefinition(pcVar1,(string *)&emitted);
    std::__cxx11::string::~string((string *)&emitted);
    pcVar12 = " ";
    if (pcVar7 != (char *)0x0) {
      pcVar12 = pcVar7;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sysFlagVar,"CMAKE_INCLUDE_SYSTEM_FLAG_",(allocator<char> *)&emitted);
    std::__cxx11::string::append((string *)&sysFlagVar);
    if (pcVar7 == (char *)0x0) {
      local_310 = cmMakefile::GetDefinition(this->Makefile,&sysFlagVar);
    }
    else {
      local_310 = (char *)0x0;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fwSearchFlagVar,"CMAKE_",(allocator<char> *)&emitted);
    std::__cxx11::string::append((string *)&fwSearchFlagVar);
    std::__cxx11::string::append((char *)&fwSearchFlagVar);
    pcVar9 = cmMakefile::GetDefinition(this->Makefile,&fwSearchFlagVar);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sysFwSearchFlagVar,"CMAKE_",(allocator<char> *)&emitted);
    std::__cxx11::string::append((string *)&sysFwSearchFlagVar);
    std::__cxx11::string::append((char *)&sysFwSearchFlagVar);
    pcVar10 = cmMakefile::GetDefinition(this->Makefile,&sysFwSearchFlagVar);
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         emitted._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    bVar4 = 0;
    emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pbVar14 = includes.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar14 !=
        includes.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
      if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) {
LAB_00188128:
        if (!(bool)(pcVar7 != (char *)0x0 & bVar4)) {
          if ((local_310 == (char *)0x0 || target == (cmGeneratorTarget *)0x0) ||
             (bVar5 = cmGeneratorTarget::IsSystemIncludeDirectory(target,pbVar14,config,lang),
             !bVar5)) {
            std::operator<<((ostream *)&includeFlags,(string *)psVar6);
          }
          else {
            std::operator<<((ostream *)&includeFlags,local_310);
          }
        }
        (*this->_vptr_cmLocalGenerator[9])
                  (&includePath,this,pbVar14,(ulong)((uint)forResponseFile * 2),
                   (ulong)forceFullPaths);
        if (((pcVar8 != (char *)0x0) && (includePath._M_string_length != 0)) &&
           (*includePath._M_dataplus._M_p != '\"')) {
          std::operator<<((ostream *)&includeFlags,"\"");
        }
        std::operator<<((ostream *)&includeFlags,(string *)&includePath);
        if (((pcVar8 != (char *)0x0) && (includePath._M_string_length != 0)) &&
           (*includePath._M_dataplus._M_p != '\"')) {
          std::operator<<((ostream *)&includeFlags,"\"");
        }
        std::operator<<((ostream *)&includeFlags,pcVar12);
        std::__cxx11::string::~string((string *)&includePath);
        bVar4 = 1;
      }
      else {
        pcVar1 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&includePath,"APPLE",(allocator<char> *)&local_1c8);
        bVar5 = cmMakefile::IsOn(pcVar1,&includePath);
        if (!bVar5) {
          std::__cxx11::string::~string((string *)&includePath);
          goto LAB_00188128;
        }
        bVar5 = cmSystemTools::IsPathToFramework(pbVar14);
        std::__cxx11::string::~string((string *)&includePath);
        if (!bVar5) goto LAB_00188128;
        std::__cxx11::string::string((string *)&includePath,(string *)pbVar14);
        std::__cxx11::string::append((char *)&includePath);
        cmsys::SystemTools::CollapseFullPath(&local_1c8,&includePath);
        std::__cxx11::string::operator=((string *)&includePath,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        pVar15 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)&emitted,&includePath);
        if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pcVar13 = pcVar9;
          if ((pcVar10 != (char *)0x0 && target != (cmGeneratorTarget *)0x0) &&
             (bVar5 = cmGeneratorTarget::IsSystemIncludeDirectory(target,pbVar14,config,lang), bVar5
             )) {
            pcVar13 = pcVar10;
          }
          std::operator<<((ostream *)&includeFlags,pcVar13);
          cmOutputConverter::ConvertToOutputFormat
                    (&local_1c8,&this->super_cmOutputConverter,&includePath,
                     (uint)forResponseFile * 2);
          poVar11 = std::operator<<((ostream *)&includeFlags,(string *)&local_1c8);
          std::operator<<(poVar11," ");
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        std::__cxx11::string::~string((string *)&includePath);
      }
    }
    std::__cxx11::stringbuf::str();
    if (((*pcVar12 != ' ') && (sVar2 = __return_storage_ptr__->_M_string_length, sVar2 != 0)) &&
       (pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p, pcVar3[sVar2 - 1] == *pcVar12)) {
      pcVar3[sVar2 - 1] = ' ';
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&emitted._M_t);
    std::__cxx11::string::~string((string *)&sysFwSearchFlagVar);
    std::__cxx11::string::~string((string *)&fwSearchFlagVar);
    std::__cxx11::string::~string((string *)&sysFlagVar);
    std::__cxx11::string::~string((string *)&flagVar);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&includeFlags);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&includes);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
  const std::vector<std::string>& includeDirs, cmGeneratorTarget* target,
  const std::string& lang, bool forceFullPaths, bool forResponseFile,
  const std::string& config)
{
  if (lang.empty()) {
    return "";
  }

  std::vector<std::string> includes = includeDirs;
  MoveSystemIncludesToEnd(includes, config, lang, target);

  OutputFormat shellFormat = forResponseFile ? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string flagVar = "CMAKE_INCLUDE_FLAG_";
  flagVar += lang;
  std::string const& includeFlag = this->Makefile->GetSafeDefinition(flagVar);
  flagVar = "CMAKE_INCLUDE_FLAG_SEP_";
  flagVar += lang;
  const char* sep = this->Makefile->GetDefinition(flagVar);
  bool quotePaths = false;
  if (this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS")) {
    quotePaths = true;
  }
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if (!sep) {
    sep = " ";
  } else {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    repeatFlag = false;
  }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  std::string sysFlagVar = "CMAKE_INCLUDE_SYSTEM_FLAG_";
  sysFlagVar += lang;
  const char* sysIncludeFlag = nullptr;
  if (repeatFlag) {
    sysIncludeFlag = this->Makefile->GetDefinition(sysFlagVar);
  }

  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += lang;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag = this->Makefile->GetDefinition(fwSearchFlagVar);

  std::string sysFwSearchFlagVar = "CMAKE_";
  sysFwSearchFlagVar += lang;
  sysFwSearchFlagVar += "_SYSTEM_FRAMEWORK_SEARCH_FLAG";
  const char* sysFwSearchFlag =
    this->Makefile->GetDefinition(sysFwSearchFlagVar);

  bool flagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  for (std::string const& i : includes) {
    if (fwSearchFlag && *fwSearchFlag && this->Makefile->IsOn("APPLE") &&
        cmSystemTools::IsPathToFramework(i)) {
      std::string frameworkDir = i;
      frameworkDir += "/../";
      frameworkDir = cmSystemTools::CollapseFullPath(frameworkDir);
      if (emitted.insert(frameworkDir).second) {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(i, config, lang)) {
          includeFlags << sysFwSearchFlag;
        } else {
          includeFlags << fwSearchFlag;
        }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
                     << " ";
      }
      continue;
    }

    if (!flagUsed || repeatFlag) {
      if (sysIncludeFlag && target &&
          target->IsSystemIncludeDirectory(i, config, lang)) {
        includeFlags << sysIncludeFlag;
      } else {
        includeFlags << includeFlag;
      }
      flagUsed = true;
    }
    std::string includePath =
      this->ConvertToIncludeReference(i, shellFormat, forceFullPaths);
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << includePath;
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << sep;
  }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if ((sep[0] != ' ') && !flags.empty() && flags.back() == sep[0]) {
    flags.back() = ' ';
  }
  return flags;
}